

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O2

_Bool update_component_monitor_w_array
                (ecs_world_t *world,ecs_component_monitor_t *mon,ecs_entities_t *entities)

{
  ulong component;
  ecs_type_t type;
  _Bool _Var1;
  long lVar2;
  ecs_entities_t eVar3;
  ecs_entities_t base_entities;
  ecs_entities_t local_40;
  
  if (entities == (ecs_entities_t *)0x0) {
    _Var1 = false;
  }
  else {
    _Var1 = false;
    for (lVar2 = 0; lVar2 < entities->count; lVar2 = lVar2 + 1) {
      component = entities->array[lVar2];
      if (component < 0x100) {
        ecs_component_monitor_mark(mon,component);
      }
      else if ((component & 0xff00000000000000) == 0xfd00000000000000) {
        _Var1 = true;
      }
      else if ((component & 0xff00000000000000) == 0xfe00000000000000) {
        type = ecs_get_type(world,component & 0xffffffffffffff);
        eVar3 = ecs_type_to_entities(type);
        local_40.array = eVar3.array;
        local_40.count = eVar3.count;
        update_component_monitor_w_array(world,mon,&local_40);
      }
    }
  }
  return _Var1;
}

Assistant:

static
bool update_component_monitor_w_array(
    ecs_world_t *world,
    ecs_component_monitor_t * mon,
    ecs_entities_t * entities)
{
    bool childof_changed = false;

    if (!entities) {
        return false;
    }

    int i;
    for (i = 0; i < entities->count; i ++) {
        ecs_entity_t component = entities->array[i];
        if (component < ECS_HI_COMPONENT_ID) {
            ecs_component_monitor_mark(mon, component);
        } else if (ECS_HAS_ROLE(component, CHILDOF)) {
            childof_changed = true;
        } else if (ECS_HAS_ROLE(component, INSTANCEOF)) {
            /* If an INSTANCEOF relationship is added to a monitored entity (can
             * be either a parent or a base) component monitors need to be
             * evaluated for the components of the prefab. */
            ecs_entity_t base = component & ECS_COMPONENT_MASK;
            ecs_type_t type = ecs_get_type(world, base);
            ecs_entities_t base_entities = ecs_type_to_entities(type);

            /* This evaluates the component monitor for all components of the
             * base entity. If the base entity contains INSTANCEOF relationships
             * these will be evaluated recursively as well. */
            update_component_monitor_w_array(world, mon, &base_entities);               
        }
    }

    return childof_changed;
}